

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O0

void concept_suite::random_access_iterator_greater_equal(void)

{
  initializer_list<int> __l;
  bool bVar1;
  size_type length;
  iterator local_110;
  iterator local_100;
  iterator local_f0;
  iterator local_e0;
  iterator local_d0;
  iterator local_c0;
  iterator local_b0;
  iterator local_a0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  undefined1 local_78 [8];
  circular_view<int,_18446744073709551615UL> span;
  allocator<int> local_41;
  int local_40 [4];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> data;
  
  local_40[0] = 0xb;
  local_40[1] = 0x16;
  local_40[2] = 0x21;
  local_40[3] = 0x2c;
  local_30 = local_40;
  local_28 = 4;
  std::allocator<int>::allocator(&local_41);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l,&local_41);
  std::allocator<int>::~allocator(&local_41);
  local_80._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_20);
  local_88._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_20);
  local_90._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_20);
  length = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)local_20);
  vista::circular_view<int,18446744073709551615ul>::
  circular_view<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,18446744073709551615ul> *)local_78,local_80,local_88,local_90,length
            );
  local_a0 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_78);
  local_b0 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator>=
                    (&local_a0,&local_b0);
  boost::detail::test_impl
            ("span.begin() >= span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x10d,"void concept_suite::random_access_iterator_greater_equal()",bVar1);
  local_c0 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_78);
  local_d0 = vista::circular_view<int,_18446744073709551615UL>::end
                       ((circular_view<int,_18446744073709551615UL> *)local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator>=
                    (&local_c0,&local_d0);
  boost::detail::test_impl
            ("!(span.begin() >= span.end())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x10e,"void concept_suite::random_access_iterator_greater_equal()",!bVar1);
  local_e0 = vista::circular_view<int,_18446744073709551615UL>::end
                       ((circular_view<int,_18446744073709551615UL> *)local_78);
  local_f0 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator>=
                    (&local_e0,&local_f0);
  boost::detail::test_impl
            ("span.end() >= span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x10f,"void concept_suite::random_access_iterator_greater_equal()",bVar1);
  local_100 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_78);
  local_110 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator>=
                    (&local_100,&local_110);
  boost::detail::test_impl
            ("span.end() >= span.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x110,"void concept_suite::random_access_iterator_greater_equal()",bVar1);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  return;
}

Assistant:

void random_access_iterator_greater_equal()
{
    // a >= b
    std::vector<int> data = { 11, 22, 33, 44 };
    circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    BOOST_TEST(span.begin() >= span.begin());
    BOOST_TEST(!(span.begin() >= span.end()));
    BOOST_TEST(span.end() >= span.begin());
    BOOST_TEST(span.end() >= span.end());
}